

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

RuntimeError * __thiscall
jsonnet::internal::anon_unknown_0::Stack::makeError
          (RuntimeError *__return_storage_ptr__,Stack *this,LocationRange *loc,string *msg)

{
  pointer pFVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  RuntimeError *pRVar4;
  bool bVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  ulong uVar8;
  ulong uVar9;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> stack_trace;
  string name;
  string local_148;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_128;
  string *local_110;
  RuntimeError *local_108;
  ulong local_100;
  pointer local_f8;
  pointer local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_> local_c8;
  string local_b0;
  TraceFrame local_90;
  
  local_128.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"",(allocator<char> *)&local_b0);
  TraceFrame::TraceFrame(&local_90,loc,&local_148);
  local_110 = msg;
  local_108 = __return_storage_ptr__;
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  emplace_back<jsonnet::internal::TraceFrame>(&local_128,&local_90);
  TraceFrame::~TraceFrame(&local_90);
  std::__cxx11::string::~string((string *)&local_148);
  uVar8 = ((long)(this->stack).
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->stack).
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start) / 400 & 0xffffffff;
  do {
    do {
      uVar8 = uVar8 - 1;
      if ((int)(uint)uVar8 < 0) {
        std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
        vector(&local_c8,&local_128);
        pRVar4 = local_108;
        RuntimeError::RuntimeError(local_108,&local_c8,local_110);
        std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
        ~vector(&local_c8);
        std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
        ~vector(&local_128);
        return pRVar4;
      }
      uVar9 = (ulong)((uint)uVar8 & 0x7fffffff);
      pFVar1 = (this->stack).
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (pFVar1[uVar9].kind != FRAME_CALL);
    local_f8 = pFVar1 + uVar9;
    p_Var2 = (_Base_ptr)local_f8->context;
    if (p_Var2 != (_Base_ptr)0x0) {
      local_90.location.file._M_dataplus._M_p = (pointer)&local_90.location.file.field_2;
      local_90.location.file._M_string_length = 0;
      local_90.location.file.field_2._M_local_buf[0] = '\0';
      local_100 = uVar8;
      do {
        if ((int)uVar9 < 1) break;
        uVar9 = uVar9 - 1;
        pFVar1 = (this->stack).
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_f0 = pFVar1 + uVar9;
        for (p_Var6 = *(_Base_ptr *)((long)&pFVar1[uVar9].bindings._M_t._M_impl + 0x18);
            p_Var6 != (_Rb_tree_node_base *)((long)&pFVar1[uVar9].bindings._M_t._M_impl + 8U);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          p_Var3 = p_Var6[1]._M_parent;
          if (((*(char *)((long)&p_Var3->_M_parent + 2) == '\x01') &&
              (((ulong)p_Var3->_M_left & 0x10) != 0)) && (p_Var3->_M_right == p_Var2)) {
            encode_utf8(&local_148,*(UString **)(p_Var6 + 1));
            std::__cxx11::string::operator=((string *)&local_90,(string *)&local_148);
            std::__cxx11::string::~string((string *)&local_148);
          }
        }
      } while (local_f0->kind != FRAME_CALL);
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_90,"");
      if (bVar5) {
        std::__cxx11::string::assign((char *)&local_90);
      }
      lVar7 = __dynamic_cast(p_Var2,&(anonymous_namespace)::HeapEntity::typeinfo,
                             &(anonymous_namespace)::HeapObject::typeinfo,0);
      uVar8 = local_100;
      __return_storage_ptr___00 = &local_148;
      if (lVar7 == 0) {
        lVar7 = __dynamic_cast(p_Var2,&(anonymous_namespace)::HeapEntity::typeinfo,
                               &(anonymous_namespace)::HeapThunk::typeinfo,0);
        if (lVar7 == 0) {
          if (p_Var2[3]._M_parent == (_Base_ptr)0x0) {
            std::operator+(__return_storage_ptr___00,"builtin function <",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &p_Var2[3]._M_left);
            std::operator+(&local_e8,__return_storage_ptr___00,">");
          }
          else {
            std::operator+(__return_storage_ptr___00,"function <",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90);
            std::operator+(&local_e8,__return_storage_ptr___00,">");
          }
          goto LAB_001c03af;
        }
        if (*(UString **)(lVar7 + 0x20) != (UString *)0x0) {
          encode_utf8(&local_b0,*(UString **)(lVar7 + 0x20));
          std::operator+(__return_storage_ptr___00,"thunk <",&local_b0);
          std::operator+(&local_e8,__return_storage_ptr___00,">");
          std::__cxx11::string::~string((string *)__return_storage_ptr___00);
          __return_storage_ptr___00 = &local_b0;
          goto LAB_001c03af;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"",(allocator<char> *)__return_storage_ptr___00);
      }
      else {
        std::operator+(__return_storage_ptr___00,"object <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_90);
        std::operator+(&local_e8,__return_storage_ptr___00,">");
LAB_001c03af:
        std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      }
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::operator=
                ((string *)
                 &local_128.
                  super__Vector_base<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].name,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    pFVar1 = local_f8;
    if (((local_f8->location).begin.line != 0) || ((local_f8->location).file._M_string_length != 0))
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"",(allocator<char> *)&local_b0);
      TraceFrame::TraceFrame(&local_90,&pFVar1->location,&local_148);
      std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
      emplace_back<jsonnet::internal::TraceFrame>(&local_128,&local_90);
      TraceFrame::~TraceFrame(&local_90);
      std::__cxx11::string::~string((string *)&local_148);
    }
  } while( true );
}

Assistant:

RuntimeError makeError(const LocationRange &loc, const std::string &msg)
    {
        std::vector<TraceFrame> stack_trace;
        stack_trace.push_back(TraceFrame(loc));
        for (int i = stack.size() - 1; i >= 0; --i) {
            const auto &f = stack[i];
            if (f.isCall()) {
                if (f.context != nullptr) {
                    // Give the last line a name.
                    stack_trace[stack_trace.size() - 1].name = getName(i, f.context);
                }
                if (f.location.isSet() || f.location.file.length() > 0)
                    stack_trace.push_back(TraceFrame(f.location));
            }
        }
        return RuntimeError(stack_trace, msg);
    }